

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_xor(t_parser *this,bool a_assignable)

{
  t_script *ptVar1;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar2;
  t_at at;
  t_script *local_50;
  _Alloc_hider local_48;
  size_type sStack_40;
  undefined8 local_38;
  
  lVar2 = CONCAT71(in_register_00000031,a_assignable);
  f_and(this,a_assignable);
  if ((*(char *)(lVar2 + 0x68) == '\0') && (*(int *)(lVar2 + 0x88) == 0x16)) {
    do {
      local_38 = *(size_type *)(lVar2 + 0x60);
      local_48._M_p = *(pointer *)(lVar2 + 0x50);
      sStack_40 = *(size_type *)(lVar2 + 0x58);
      t_lexer::f_next((t_lexer *)(lVar2 + 8));
      ptVar1 = (t_script *)operator_new(0x38);
      f_and((t_parser *)&stack0xffffffffffffffb0,a_assignable);
      (ptVar1->v_path).field_2._M_allocated_capacity = local_38;
      (ptVar1->v_path)._M_dataplus._M_p = local_48._M_p;
      (ptVar1->v_path)._M_string_length = sStack_40;
      (ptVar1->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_binary_0019b250;
      (ptVar1->v_path).field_2._M_local_buf[2] = L'ǣ';
      (ptVar1->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)this->v_module;
      (ptVar1->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)local_50;
      this->v_module = ptVar1;
      if (*(char *)(lVar2 + 0x68) != '\0') {
        return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                  )this;
      }
    } while (*(int *)(lVar2 + 0x88) == 0x16);
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_xor(bool a_assignable)
{
	auto node = f_and(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__HAT) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, c_instruction__XOR_TT, std::move(node), f_and(false)));
	}
	return node;
}